

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper::
~initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper
          (initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper *this)

{
  ~initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper
            ((initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOnResponse_ReceivedResponseBeforeSendingLogOnRequest) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  object->logon();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  CHECK(!object->sentLogout());
}